

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O0

void __thiscall
asio::detail::strand_service::post<tonk::Connection::tonk_flush()::__0>
          (strand_service *this,implementation_type *impl,type *handler)

{
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27)>
  *this_00;
  type *in_RDI;
  ptr p;
  bool is_continuation;
  implementation_type *in_stack_ffffffffffffffb8;
  strand_service *in_stack_ffffffffffffffc0;
  
  asio_handler_cont_helpers::is_continuation<tonk::Connection::tonk_flush()::__0>((type *)0x1b9c36);
  this_00 = completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27)>
            ::ptr::allocate((type *)in_stack_ffffffffffffffc0);
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27)>
  ::completion_handler(this_00,in_RDI);
  do_post(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,&this_00->super_operation,
          SUB81((ulong)in_RDI >> 0x38,0));
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27)>
  ::ptr::~ptr((ptr *)0x1b9cb5);
  return;
}

Assistant:

void strand_service::post(strand_service::implementation_type& impl,
    Handler& handler)
{
  bool is_continuation =
    asio_handler_cont_helpers::is_continuation(handler);

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "post"));

  do_post(impl, p.p, is_continuation);
  p.v = p.p = 0;
}